

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTypeHandler.cpp
# Opt level: O2

void __thiscall
Js::PathTypeSingleSuccessorInfo::ReplaceSuccessor
          (PathTypeSingleSuccessorInfo *this,DynamicType *type,PathTypeSuccessorKey key,
          RecyclerWeakReference<Js::DynamicType> *typeWeakRef)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  if (((this->successorKey).propertyId != key.propertyId) ||
     ((this->successorKey).attributes != key.attributes)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                ,0xab,"(successorKey == key)","successorKey == key");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::DynamicType>_>::WriteBarrierSet
            (&this->successorTypeWeakRef,typeWeakRef);
  return;
}

Assistant:

void PathTypeSingleSuccessorInfo::ReplaceSuccessor(DynamicType * type, const PathTypeSuccessorKey key, RecyclerWeakReference<DynamicType> * typeWeakRef)
    {
        Assert(successorKey == key);
        successorTypeWeakRef = typeWeakRef;
    }